

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

bool __thiscall absl::lts_20240722::Cord::EndsWith(Cord *this,string_view rhs)

{
  byte bVar1;
  bool bVar2;
  ulong size_to_compare;
  size_t sVar3;
  Cord tmp;
  anon_union_16_2_39e9c77e_for_Rep_0 local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  size_to_compare = rhs._M_len;
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)(char)bVar1 & 1U) == 0) {
    sVar3 = (ulong)(long)(char)bVar1 >> 1;
  }
  else {
    sVar3 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (sVar3 < size_to_compare) {
    bVar2 = false;
  }
  else {
    local_48.as_tree.rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (local_48.as_tree.rep == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      local_48.as_tree.cordz_info = (this->contents_).data_.rep_.field_0.as_tree.cordz_info;
      local_48.as_tree.rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
    }
    else {
      LOCK();
      ((local_48.as_tree.rep)->refcount).count_.super___atomic_base<int>._M_i =
           ((local_48.as_tree.rep)->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      local_48.as_tree.cordz_info = 1;
      bVar2 = cord_internal::InlineData::is_either_profiled
                        ((InlineData *)&local_48.as_tree,(InlineData *)this);
      if (bVar2) {
        absl::lts_20240722::cord_internal::CordzInfo::MaybeTrackCordImpl
                  ((InlineData *)&local_48.as_tree,(InlineData *)this,kConstructorCord);
      }
    }
    RemovePrefix((Cord *)&local_48.as_tree,sVar3 - size_to_compare);
    local_30._M_len = size_to_compare;
    local_30._M_str = rhs._M_str;
    bVar2 = GenericCompare<bool,std::basic_string_view<char,std::char_traits<char>>>
                      ((Cord *)&local_48.as_tree,&local_30,size_to_compare);
    ~Cord((Cord *)&local_48.as_tree);
  }
  return bVar2;
}

Assistant:

bool Cord::EndsWith(absl::string_view rhs) const {
  size_t my_size = size();
  size_t rhs_size = rhs.size();

  if (my_size < rhs_size) return false;

  Cord tmp(*this);
  tmp.RemovePrefix(my_size - rhs_size);
  return tmp.EqualsImpl(rhs, rhs_size);
}